

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# split.hpp
# Opt level: O2

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* boost::algorithm::
  split<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::__cxx11::string,boost::algorithm::detail::is_any_ofF<char>>
            (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *Result,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *Input,
            is_any_ofF<char> *Pred,token_compress_mode_type eCompress)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar1;
  token_compress_mode_type eCompress_00;
  is_any_ofF<char> iStack_58;
  token_finderF<boost::algorithm::detail::is_any_ofF<char>_> local_40;
  
  eCompress_00 = eCompress;
  detail::is_any_ofF<char>::is_any_ofF(&iStack_58,Pred);
  token_finder<boost::algorithm::detail::is_any_ofF<char>>
            (&local_40,(algorithm *)&iStack_58,(is_any_ofF<char> *)(ulong)eCompress,eCompress_00);
  pvVar1 = iter_split<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::__cxx11::string,boost::algorithm::detail::token_finderF<boost::algorithm::detail::is_any_ofF<char>>>
                     (Result,Input,&local_40);
  detail::is_any_ofF<char>::~is_any_ofF(&local_40.m_Pred);
  detail::is_any_ofF<char>::~is_any_ofF(&iStack_58);
  return pvVar1;
}

Assistant:

inline SequenceSequenceT& split(
            SequenceSequenceT& Result,
            RangeT& Input,
            PredicateT Pred,
            token_compress_mode_type eCompress=token_compress_off )
        {
            return ::boost::algorithm::iter_split(
                Result,
                Input,
                ::boost::algorithm::token_finder( Pred, eCompress ) );         
        }